

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqmodules.cpp
# Opt level: O0

void __thiscall SqModules::registerIoLib(SqModules *this)

{
  Object *pOVar1;
  SqModules *unaff_retaddr;
  char *in_stack_00000008;
  SqModules *in_stack_00000010;
  string *module_name;
  SqModules *in_stack_ffffffffffffffc0;
  allocator<char> *in_stack_ffffffffffffffd0;
  char *in_stack_ffffffffffffffd8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffffe0;
  
  module_name = (string *)&stack0xffffffffffffffd7;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_ffffffffffffffe0,in_stack_ffffffffffffffd8,in_stack_ffffffffffffffd0);
  pOVar1 = findNativeModule(in_stack_ffffffffffffffc0,module_name);
  std::__cxx11::string::~string((string *)&stack0xffffffffffffffd8);
  std::allocator<char>::~allocator((allocator<char> *)&stack0xffffffffffffffd7);
  if (pOVar1 == (Object *)0x0) {
    registerIoStreamLib(unaff_retaddr);
  }
  registerStdLibNativeModule(in_stack_00000010,in_stack_00000008,(RegFunc)unaff_retaddr);
  return;
}

Assistant:

void SqModules::registerIoLib()
{
  if (!findNativeModule("iostream"))
  {
    // register 'iostream' module containing basestream class and blob
    registerIoStreamLib();
  }

  registerStdLibNativeModule("io", sqstd_register_iolib);
}